

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.cpp
# Opt level: O2

ostream * tactile::operator<<(ostream *os,Range *r)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"[");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,r->fMin);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,r->fMax);
  poVar1 = std::operator<<(poVar1,"]");
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Range &r)
{
	return os << "[" << r.min() << "," << r.max() << "]";
}